

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data;
  curl_xferinfo_callback p_Var1;
  curl_progress_callback p_Var2;
  FILE *whereto;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  time_t tVar7;
  long lVar8;
  long lVar9;
  curl_off_t cVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  timeval newer;
  timeval older;
  long local_b0;
  long local_a8;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  iVar14 = (data->progress).speeder_c;
  newer = curlx_tvnow();
  lVar5 = newer.tv_sec;
  dVar3 = curlx_tvdiff_secs(newer,(data->progress).start);
  (data->progress).timespent = dVar3;
  lVar8 = (data->progress).downloaded;
  lVar9 = (data->progress).lastshow;
  dVar4 = (double)(~-(ulong)(0.0 < dVar3) & 0x3ff0000000000000 |
                  -(ulong)(0.0 < dVar3) & (ulong)dVar3);
  lVar6 = (long)((double)lVar8 / dVar4);
  (data->progress).dlspeed = lVar6;
  lVar12 = (data->progress).uploaded;
  lVar11 = (long)((double)lVar12 / dVar4);
  (data->progress).ulspeed = lVar11;
  if (lVar9 != lVar5) {
    iVar14 = iVar14 % 6;
    (data->progress).lastshow = lVar5;
    if (lVar12 < lVar8) {
      lVar12 = lVar8;
    }
    (data->progress).speeder[iVar14] = lVar12;
    (data->progress).speeder_time[iVar14].tv_sec = lVar5;
    (data->progress).speeder_time[iVar14].tv_usec = newer.tv_usec;
    iVar16 = (data->progress).speeder_c;
    (data->progress).speeder_c = iVar16 + 1U;
    if (iVar16 == 0) {
      if (lVar6 < lVar11) {
        lVar6 = lVar11;
      }
    }
    else {
      uVar15 = 0;
      if (4 < iVar16) {
        uVar15 = (iVar16 + 1U) % 6;
      }
      older.tv_usec =
           *(__suseconds_t *)
            ((long)&(data->progress).speeder_time[0].tv_usec + (ulong)(uVar15 << 4));
      older.tv_sec = *(__time_t *)
                      ((long)&(data->progress).speeder_time[0].tv_sec + (ulong)(uVar15 << 4));
      tVar7 = curlx_tvdiff(newer,older);
      lVar6 = tVar7 + (ulong)(tVar7 == 0);
      lVar8 = (data->progress).speeder[iVar14] - (data->progress).speeder[uVar15];
      if (lVar8 < 0x418938) {
        lVar6 = (lVar8 * 1000) / lVar6;
      }
      else {
        lVar6 = (long)((double)lVar8 / ((double)lVar6 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar6;
  }
  uVar15 = (data->progress).flags;
  if ((uVar15 & 0x10) != 0) {
    return 0;
  }
  p_Var1 = (data->set).fxferinfo;
  if (p_Var1 != (curl_xferinfo_callback)0x0) {
    iVar14 = (*p_Var1)((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
LAB_0010ac73:
    iVar16 = 0;
    if (iVar14 != 0) {
      Curl_failf(data,"Callback aborted");
      iVar16 = iVar14;
    }
    return iVar16;
  }
  p_Var2 = (data->set).fprogress;
  if (p_Var2 != (curl_progress_callback)0x0) {
    iVar14 = (*p_Var2)((data->set).progress_client,(double)(data->progress).size_dl,
                       (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                       (double)(data->progress).uploaded);
    goto LAB_0010ac73;
  }
  if (lVar9 == lVar5) {
    return 0;
  }
  if (-1 < (char)uVar15) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %lld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar15 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar15;
  }
  if (((uVar15 & 0x20) == 0) || (lVar8 = (data->progress).ulspeed, lVar8 < 1)) {
    lVar8 = 0;
LAB_0010ad58:
    local_a8 = 0;
  }
  else {
    uVar13 = (data->progress).size_ul;
    lVar8 = (long)uVar13 / lVar8;
    if ((long)uVar13 < 0x2711) {
      if ((long)uVar13 < 1) goto LAB_0010ad58;
      cVar10 = (data->progress).uploaded * 100;
    }
    else {
      cVar10 = (data->progress).uploaded;
      uVar13 = uVar13 / 100;
    }
    local_a8 = cVar10 / (long)uVar13;
  }
  if (((uVar15 & 0x40) == 0) || (lVar9 = (data->progress).dlspeed, lVar9 < 1)) {
    lVar9 = 0;
LAB_0010add6:
    local_b0 = 0;
  }
  else {
    uVar13 = (data->progress).size_dl;
    lVar9 = (long)uVar13 / lVar9;
    if ((long)uVar13 < 0x2711) {
      if ((long)uVar13 < 1) goto LAB_0010add6;
      cVar10 = (data->progress).downloaded * 100;
    }
    else {
      cVar10 = (data->progress).downloaded;
      uVar13 = uVar13 / 100;
    }
    local_b0 = cVar10 / (long)uVar13;
  }
  if (lVar9 < lVar8) {
    lVar9 = lVar8;
  }
  cVar10 = 0;
  if (0 < lVar9) {
    cVar10 = lVar9 - (long)dVar3;
  }
  time2str(time_left,cVar10);
  time2str(time_total,lVar9);
  time2str(time_spent,(long)dVar3);
  uVar15 = (data->progress).flags;
  uVar13 = (&(data->progress).size_dl)[(ulong)((uVar15 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar15 & 0x20) == 0) * 2];
  lVar8 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar13 < 0x2711) {
    if ((long)uVar13 < 1) {
      lVar8 = 0;
    }
    else {
      lVar8 = (lVar8 * 100) / (long)uVar13;
    }
  }
  else {
    lVar8 = lVar8 / (long)(uVar13 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar13,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3lld %s  %3lld %s  %3lld %s  %s  %s %s %s %s %s",lVar8,max5 + 2,local_b0
                ,max5,local_a8,max5 + 1,max5 + 3,max5 + 4,time_total,time_spent,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct timeval now;
  int result;
  char max5[6][10];
  curl_off_t dlpercen=0;
  curl_off_t ulpercen=0;
  curl_off_t total_percen=0;
  curl_off_t total_transfer;
  curl_off_t total_expected_transfer;
  curl_off_t timespent;
  struct Curl_easy *data = conn->data;
  int nowindex = data->progress.speeder_c% CURR_TIME;
  int checkindex;
  int countindex; /* amount of seconds stored in the speeder array */
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t ulestimate=0;
  curl_off_t dlestimate=0;
  curl_off_t total_estimate;
  bool shownow=FALSE;

  now = Curl_tvnow(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent = curlx_tvdiff_secs(now, data->progress.start);
  timespent = (curl_off_t)data->progress.timespent;

  /* The average download speed this far */
  data->progress.dlspeed = (curl_off_t)
    ((double)data->progress.downloaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* The average upload speed this far */
  data->progress.ulspeed = (curl_off_t)
    ((double)data->progress.uploaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != now.tv_sec) {
    shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, which should use the fastest
       of the dl/ul speeds. Store the faster speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded>data->progress.uploaded?
      data->progress.downloaded:data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c>=CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      time_t span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c>=CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_tvdiff(now,
                            data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms=1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the main average */
      data->progress.current_speed =
        (data->progress.ulspeed>data->progress.dlspeed)?
        data->progress.ulspeed:data->progress.dlspeed;

  } /* Calculations end */

  if(!(data->progress.flags & PGRS_HIDE)) {
    /* progress meter has not been shut off */

    if(data->set.fxferinfo) {
      /* There's a callback set, call that */
      result= data->set.fxferinfo(data->set.progress_client,
                                  data->progress.size_dl,
                                  data->progress.downloaded,
                                  data->progress.size_ul,
                                  data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    else if(data->set.fprogress) {
      /* The older deprecated callback is set, call that */
      result= data->set.fprogress(data->set.progress_client,
                                  (double)data->progress.size_dl,
                                  (double)data->progress.downloaded,
                                  (double)data->progress.size_ul,
                                  (double)data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }

    if(!shownow)
      /* only show the internal progress meter once per second */
      return 0;

    /* If there's no external callback set, use internal code to show
       progress */

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      (data->progress.flags & PGRS_UL_SIZE_KNOWN?
       data->progress.size_ul:data->progress.uploaded)+
      (data->progress.flags & PGRS_DL_SIZE_KNOWN?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5]) /* current speed */
            );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);

  } /* !(data->progress.flags & PGRS_HIDE) */

  return 0;
}